

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

void pop_up_invoke_options_proc(Am_Object *cmd)

{
  Am_Slot_Key AVar1;
  int value;
  Am_Wrapper *value_00;
  Am_Value *pAVar2;
  Am_Object match_command;
  Am_Object invoke_window;
  Am_Input_Char accel_char;
  Am_Object script_execute_command;
  Am_Object script_window;
  char accel_string [38];
  
  Am_Object::Get_Object((Am_Object *)accel_string,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&script_window,(Am_Slot_Flags)accel_string);
  Am_Object::~Am_Object((Am_Object *)accel_string);
  get_invoke_window();
  AVar1 = Am_SCRIPT_WINDOW;
  value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&script_window);
  Am_Object::Set(&invoke_window,AVar1,value_00,0);
  pAVar2 = Am_Object::Get(&script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&script_execute_command,pAVar2);
  AVar1 = Am_INVOKE_MATCH_COMMAND;
  pAVar2 = Am_Object::Get(&script_execute_command,Am_BEFORE_OR_AFTER_COMMAND,0);
  Am_Object::Set(&invoke_window,AVar1,pAVar2,0);
  pAVar2 = Am_Object::Get(&script_execute_command,0x152,0);
  Am_Input_Char::Am_Input_Char(&accel_char,pAVar2);
  if (accel_char.code == 0) {
    accel_string[0] = '\0';
  }
  else {
    Am_Input_Char::As_Short_String(&accel_char,accel_string);
  }
  Am_Object::Get_Object(&match_command,(Am_Slot_Key)&invoke_window,(ulong)Am_DO_ACCELERATOR);
  Am_Object::Set(&match_command,0x169,accel_char.code != 0,0);
  Am_Object::~Am_Object(&match_command);
  Am_Object::Get_Object(&match_command,(Am_Slot_Key)&invoke_window,0x152);
  Am_Object::Set(&match_command,0x169,accel_string,0);
  Am_Object::~Am_Object(&match_command);
  pAVar2 = Am_Object::Get(&script_execute_command,Am_BEFORE_OR_AFTER,0);
  value = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Get_Object(&match_command,(Am_Slot_Key)&invoke_window,(ulong)Am_BEFORE_OR_AFTER);
  Am_Object::Set(&match_command,0x169,value,0);
  Am_Object::~Am_Object(&match_command);
  if (value == 0) {
    Am_Object::Get_Object(&match_command,(Am_Slot_Key)&invoke_window,(ulong)Am_UNDO_SCROLL_GROUP);
    Am_Object::Set(&match_command,0xa2,0,0);
  }
  else {
    pAVar2 = Am_Object::Get(&script_execute_command,Am_BEFORE_OR_AFTER_COMMAND,0);
    Am_Object::Am_Object(&match_command,pAVar2);
    am_set_commands_into_script_window(&invoke_window,&match_command);
  }
  Am_Object::~Am_Object(&match_command);
  Am_Object::Set(&invoke_window,0x69,true,0);
  Am_Object::~Am_Object(&script_execute_command);
  Am_Object::~Am_Object(&invoke_window);
  Am_Object::~Am_Object(&script_window);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, pop_up_invoke_options, (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object invoke_window = get_invoke_window();
  invoke_window.Set(Am_SCRIPT_WINDOW, script_window);

  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  invoke_window.Set(Am_INVOKE_MATCH_COMMAND,
                    script_execute_command.Get(Am_BEFORE_OR_AFTER_COMMAND));

  //deal with accel chars
  Am_Input_Char accel_char = script_execute_command.Get(Am_ACCELERATOR);
  char accel_string[Am_LONGEST_CHAR_STRING];
  if (accel_char.Valid())
    accel_char.As_Short_String(accel_string);
  else
    accel_string[0] = 0; //zero length string;
  invoke_window.Get_Object(Am_DO_ACCELERATOR).Set(Am_VALUE, accel_char.Valid());
  invoke_window.Get_Object(Am_ACCELERATOR).Set(Am_VALUE, accel_string);

  // deal with before/after commands
  int before_after = script_execute_command.Get(Am_BEFORE_OR_AFTER);
  invoke_window.Get_Object(Am_BEFORE_OR_AFTER).Set(Am_VALUE, before_after);
  if (before_after != 0) {
    Am_Object match_command =
        script_execute_command.Get(Am_BEFORE_OR_AFTER_COMMAND);
    am_set_commands_into_script_window(invoke_window, match_command);
  } else
    invoke_window.Get_Object(Am_UNDO_SCROLL_GROUP).Set(Am_ITEMS, (0L));
  invoke_window.Set(Am_VISIBLE, true);
}